

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall application::application(application *this)

{
  io_service *this_00;
  signal_set_service *this_01;
  signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *op;
  ptr local_60;
  stream_descriptor *local_48;
  signal_set *local_40;
  anon_class_8_1_8991fb9c local_38;
  
  memset(this,0,0xa8);
  cab_manager::cab_manager(&this->_cab_manager);
  this_00 = &this->_io_service;
  boost::asio::io_context::io_context(this_00);
  (this->_cab_server)._M_t.super___uniq_ptr_impl<cab_server,_std::default_delete<cab_server>_>._M_t.
  super__Tuple_impl<0UL,_cab_server_*,_std::default_delete<cab_server>_>.
  super__Head_base<0UL,_cab_server_*,_false>._M_head_impl = (cab_server *)0x0;
  boost::asio::
  basic_signal_set<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_signal_set<boost::asio::io_context>(&this->_signals,this_00,2,(type *)0x0);
  local_60.h = (anon_class_8_1_8991fb9c *)((ulong)local_60.h._4_4_ << 0x20);
  local_40 = &this->_signals;
  boost::asio::posix::
  basic_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_descriptor<boost::asio::io_context>
            (&(this->_command_descriptor).
              super_basic_descriptor<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ,this_00,(native_handle_type *)&local_60,(type *)0x0);
  local_48 = &this->_command_descriptor;
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->_command_buffer,0xffffffffffffffff,(allocator<char> *)&local_60);
  local_60.h = &local_38;
  this_01 = (this->_signals).impl_.service_;
  local_38.this = this;
  op = (signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)boost::asio::asio_handler_allocate(0x68);
  (op->super_signal_op).super_operation.next_ = (scheduler_operation *)0x0;
  (op->super_signal_op).super_operation.func_ =
       boost::asio::detail::
       signal_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/application.cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_signal_op).super_operation.task_result_ = 0;
  (op->super_signal_op).ec_.val_ = 0;
  (op->super_signal_op).ec_.failed_ = false;
  (op->super_signal_op).ec_.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  (op->super_signal_op).signal_number_ = 0;
  (op->handler_).this = local_38.this;
  local_60.v = op;
  boost::asio::detail::
  handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
  ::handler_work_base(&(op->work_).
                       super_handler_work_base<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_boost::asio::io_context,_boost::asio::executor,_void>
                      ,&(this->_signals).impl_.executor_);
  local_60.p = op;
  boost::asio::detail::signal_set_service::start_wait_op
            (this_01,&(this->_signals).impl_.implementation_,(signal_op *)op);
  local_60.v = (signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  local_60.p = (signal_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Stazer[P]autonomouscabs_backend_application_cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)0x0;
  boost::asio::detail::
  signal_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/backend/application.cpp:21:25),_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::~ptr(&local_60);
  handle_command(this);
  return;
}

Assistant:

application::application():
    _cab_manager(),
    _io_service(),
    _cab_server(),
    _signals(_io_service, SIGINT),
    _command_descriptor(_io_service, STDIN_FILENO),
    _command_buffer()
{
    _signals.async_wait([this](const boost::system::error_code& error_code, int signal)
    {
        if(!error_code)
        {
            std::cout << "Received SIGINT\n";
            _io_service.stop();
        }
    });

    handle_command();
}